

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Node::Node(Node *this,string *name,string *label,string *shape)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  pcVar1 = (label->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->label,pcVar1,pcVar1 + label->_M_string_length);
  (this->shape)._M_dataplus._M_p = (pointer)&(this->shape).field_2;
  pcVar1 = (shape->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->shape,pcVar1,pcVar1 + shape->_M_string_length);
  (this->extra)._M_dataplus._M_p = (pointer)&(this->extra).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->extra);
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)(this->name)._M_string_length,0x1430a4);
  sVar2 = name->_M_string_length;
  if (sVar2 != 0) {
    sVar3 = 0;
    do {
      std::__cxx11::string::push_back((char)this);
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  return;
}

Assistant:

Node::Node(const string &name, const string &label, const string &shape) : name(name), label(label), shape(shape),
                                                                           extra("") {
    this->name = "";
    for (char c: name) {
        if (c == '#')
            c = '_';
        this->name += c;
    }
}